

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

void __thiscall wasm::Literal::Literal(Literal *this,LaneArray<2> *lanes)

{
  LaneArray<2> *lanes_local;
  Literal *this_local;
  
  wasm::Type::Type(&this->type,v128);
  extractBytes<unsigned_long,2>((uint8_t (*) [16])this,lanes);
  return;
}

Assistant:

Literal::Literal(const LaneArray<2>& lanes) : type(Type::v128) {
  extractBytes<uint64_t, 2>(v128, lanes);
}